

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interactor.c
# Opt level: O2

Interactor * interactor_toplevel(Interactor *itr,uint *level_out)

{
  Interactor *pIVar1;
  uint uVar2;
  Interactor *itr_top;
  
  uVar2 = 0xffffffff;
  do {
    pIVar1 = itr;
    itr = itr->parent;
    uVar2 = uVar2 + 1;
  } while (itr != (Interactor *)0x0);
  if (level_out != (uint *)0x0) {
    *level_out = uVar2;
  }
  return pIVar1;
}

Assistant:

static Interactor *interactor_toplevel(Interactor *itr, unsigned *level_out)
{
    /*
     * Find the Interactor at the top of the chain, so that all the
     * Interactors in a stack can share that one's last-to-talk field.
     * Also, count how far we had to go to get to it, to put in the
     * message.
     */
    Interactor *itr_top = itr;
    unsigned level = 0;
    while (itr_top->parent) {
        itr_top = itr_top->parent;
        level++;
    }

    if (level_out)
        *level_out = level;
    return itr_top;
}